

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float coeff;
  Option *in_RCX;
  long in_RSI;
  long in_RDI;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  float coeff_mean;
  int dims_1;
  int scale;
  int axis;
  int i;
  int reduced_axes_num;
  int *axes_ptr;
  bool reduce_c;
  bool reduce_h;
  bool reduce_w;
  int axes_flag [3];
  int dims;
  float in_stack_ffffffffffffffa4;
  bool post_process;
  bool reduce_c_00;
  bool reduce_h_00;
  undefined4 in_stack_ffffffffffffffa8;
  bool reduce_w_00;
  int iVar4;
  float in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Mat *in_stack_ffffffffffffffb8;
  int local_38 [2];
  int in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar4 = *(int *)(in_RSI + 0x28);
  memset(local_38,0,0xc);
  bVar2 = false;
  bVar1 = false;
  bVar3 = false;
  if (*(int *)(in_RDI + 0x84) == 0) {
    in_stack_ffffffffffffffb8 = (Mat *)Mat::operator_cast_to_int_((Mat *)(in_RDI + 0x90));
    in_stack_ffffffffffffffb4 = *(int *)(in_RDI + 0xbc);
    for (in_stack_ffffffffffffffb0 = 0; in_stack_ffffffffffffffb0 < in_stack_ffffffffffffffb4;
        in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 + 1) {
      in_stack_ffffffffffffffac =
           *(float *)((long)&in_stack_ffffffffffffffb8->data + (long)in_stack_ffffffffffffffb0 * 4);
      if ((int)in_stack_ffffffffffffffac < 0) {
        in_stack_ffffffffffffffac = (float)(iVar4 + 1 + (int)in_stack_ffffffffffffffac);
      }
      local_38[(int)in_stack_ffffffffffffffac + -1] = 1;
    }
    if (iVar4 == 1) {
      bVar2 = true;
    }
    else if (iVar4 == 2) {
      bVar1 = local_38[0] == 1;
      bVar2 = local_38[1] == 1;
    }
    else if (iVar4 == 3) {
      bVar3 = local_38[0] == 1;
      bVar1 = local_38[1] == 1;
      bVar2 = in_stack_ffffffffffffffd0 == 1;
    }
  }
  else {
    bVar2 = true;
    bVar1 = true;
    bVar3 = true;
  }
  post_process = SUB41(in_stack_ffffffffffffffa8,0);
  reduce_c_00 = SUB41((uint)in_stack_ffffffffffffffa8 >> 8,0);
  reduce_h_00 = SUB41((uint)in_stack_ffffffffffffffa8 >> 0x10,0);
  reduce_w_00 = SUB41((uint)in_stack_ffffffffffffffa8 >> 0x18,0);
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_4 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_4 = reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 2) {
    local_4 = reduction<ncnn::reduction_op_sumsq<float>,std::plus<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 3) {
    iVar4 = 1;
    coeff = *(float *)(in_RSI + 0x28);
    if (coeff == 1.4013e-45) {
      iVar4 = *(int *)(in_RSI + 0x2c);
    }
    else if (coeff == 2.8026e-45) {
      if (bVar2) {
        iVar4 = *(int *)(in_RSI + 0x2c);
      }
      if (bVar1) {
        iVar4 = *(int *)(in_RSI + 0x30) * iVar4;
      }
    }
    else if (coeff == 4.2039e-45) {
      if (bVar2) {
        iVar4 = *(int *)(in_RSI + 0x2c);
      }
      if (bVar1) {
        iVar4 = *(int *)(in_RSI + 0x30) * iVar4;
      }
      if (bVar3) {
        iVar4 = *(int *)(in_RSI + 0x34) * iVar4;
      }
    }
    local_4 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,SUB41((uint)iVar4 >> 0x18,0),
                         SUB41((uint)iVar4 >> 0x10,0),SUB41((uint)iVar4 >> 8,0),SUB41(iVar4,0),coeff
                         ,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 4) {
    local_4 = reduction<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 5) {
    local_4 = reduction<ncnn::reduction_op_min<float>,ncnn::reduction_op_min<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 6) {
    local_4 = reduction<std::multiplies<float>,std::multiplies<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 7) {
    local_4 = reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 8) {
    local_4 = reduction<ncnn::reduction_op_sumsq<float>,std::plus<float>,ncnn::post_process_sqrt<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 9) {
    local_4 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_log<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else if (*(int *)(in_RDI + 0x80) == 10) {
    local_4 = reduction<ncnn::reduction_op_sumsexp<float>,std::plus<float>,ncnn::post_process_log<float>>
                        (in_stack_ffffffffffffffb8,
                         (Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,reduce_w_00,reduce_h_00,reduce_c_00,post_process,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffffd0,in_RCX);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i=0; i<reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction< reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction< reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction< std::multiplies<float>, std::multiplies<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);
    
    if (operation == ReductionOp_L1)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSum)
        return reduction< std::plus<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSumExp)
        return reduction< reduction_op_sumsexp<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}